

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbarlayout.cpp
# Opt level: O2

void __thiscall QToolBarLayout::checkUsePopupMenu(QToolBarLayout *this)

{
  QToolBar *this_00;
  QSize QVar1;
  Representation RVar2;
  bool bVar3;
  Orientation OVar4;
  QWidget *this_01;
  QSize QVar5;
  QSize QVar6;
  bool set;
  long in_FS_OFFSET;
  QSize local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QToolBar **)(*(long *)&(this->super_QLayout).field_0x8 + 0x10);
  this_01 = &QtPrivate::qobject_cast_helper<QMainWindow*,QObject>
                       (*(QObject **)(*(long *)&(this_00->super_QWidget).field_0x8 + 0x10))->
             super_QWidget;
  OVar4 = QToolBar::orientation(this_00);
  set = true;
  if (this_01 != (QWidget *)0x0) {
    bVar3 = QToolBar::isFloating(this_00);
    if (!bVar3) {
      local_38 = QWidget::size(this_01);
      QVar5 = expandedSize(this,&local_38);
      QVar6 = QWidget::size(this_01);
      QVar1 = (QSize)((ulong)QVar5 >> 0x20);
      if (OVar4 == Vertical) {
        QVar1 = QVar5;
      }
      RVar2 = QVar6.ht.m_i;
      if (OVar4 == Vertical) {
        RVar2 = QVar6.wd.m_i;
      }
      set = RVar2.m_i <= QVar1.wd.m_i.m_i;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    setUsePopupMenu(this,set);
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QToolBarLayout::checkUsePopupMenu()
{
    QToolBar *tb = static_cast<QToolBar *>(parent());
    QMainWindow *mw = qobject_cast<QMainWindow *>(tb->parent());
    Qt::Orientation o = tb->orientation();
    setUsePopupMenu(!mw || tb->isFloating() || perp(o, expandedSize(mw->size())) >= perp(o, mw->size()));
}